

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead_common.c
# Opt level: O1

void ascon_aead_cleanup(ascon_aead_ctx_t *ctx)

{
  uint_fast8_t i;
  long lVar1;
  
  lVar1 = 0;
  (ctx->bufstate).sponge.x0 = 0;
  (ctx->bufstate).sponge.x1 = 0;
  (ctx->bufstate).sponge.x2 = 0;
  (ctx->bufstate).sponge.x3 = 0;
  (ctx->bufstate).sponge.x4 = 0;
  do {
    (ctx->bufstate).buffer[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0;
  (ctx->bufstate).buffer_len = '\0';
  (ctx->bufstate).flow_state = '\0';
  do {
    (ctx->bufstate).pad[lVar1] = '\0';
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  ctx->k0 = 0;
  ctx->k1 = 0;
  ctx->k2 = 0;
  return;
}

Assistant:

ASCON_API void
ascon_aead_cleanup(ascon_aead_ctx_t* const ctx)
{
    ASCON_ASSERT(ctx != NULL);
    // Manual cleanup using volatile pointers to have more assurance the
    // cleanup will not be removed by the optimiser.
    ((volatile ascon_aead_ctx_t*) ctx)->bufstate.sponge.x0 = 0U;
    ((volatile ascon_aead_ctx_t*) ctx)->bufstate.sponge.x1 = 0U;
    ((volatile ascon_aead_ctx_t*) ctx)->bufstate.sponge.x2 = 0U;
    ((volatile ascon_aead_ctx_t*) ctx)->bufstate.sponge.x3 = 0U;
    ((volatile ascon_aead_ctx_t*) ctx)->bufstate.sponge.x4 = 0U;
    for (uint_fast8_t i = 0; i < ASCON_DOUBLE_RATE; i++)
    {
        ((volatile ascon_aead_ctx_t*) ctx)->bufstate.buffer[i] = 0U;
    }
    ((volatile ascon_aead_ctx_t*) ctx)->bufstate.buffer_len = 0U;
    ((volatile ascon_aead_ctx_t*) ctx)->bufstate.flow_state = ASCON_FLOW_CLEANED;
    // Clearing also the padding to set the whole context to be all-zeros.
    // Makes it easier to check for initialisation and provides a known
    // state after cleanup, initialising all memory.
    for (uint_fast8_t i = 0U; i < 6U; i++)
    {
        ((volatile ascon_aead_ctx_t*) ctx)->bufstate.pad[i] = 0U;
    }
    ((volatile ascon_aead_ctx_t*) ctx)->k0 = 0U;
    ((volatile ascon_aead_ctx_t*) ctx)->k1 = 0U;
    ((volatile ascon_aead_ctx_t*) ctx)->k2 = 0U;
}